

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializeGameBoard.cpp
# Opt level: O0

list<Player,_std::allocator<Player>_> * initializeGameBoard_abi_cxx11_(void)

{
  int iVar1;
  ostream *poVar2;
  list<Player,_std::allocator<Player>_> *in_RDI;
  list<Player,_std::allocator<Player>_> local_248;
  undefined1 local_230 [8];
  GameBoard board;
  undefined1 local_1f0 [8];
  Player play;
  int i;
  int max;
  int min;
  int playernum;
  list<Player,_std::allocator<Player>_> *myplayers;
  
  iVar1 = rand();
  iVar1 = iVar1 % 7 + 2;
  std::__cxx11::list<Player,_std::allocator<Player>_>::list(in_RDI);
  for (play.names.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      play.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < iVar1;
      play.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           play.names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    Player::Player((Player *)local_1f0,0x28,0x3c);
    std::__cxx11::list<Player,_std::allocator<Player>_>::push_back(in_RDI,(value_type *)local_1f0);
    Player::~Player((Player *)local_1f0);
  }
  std::__cxx11::list<Player,_std::allocator<Player>_>::list(&local_248,in_RDI);
  GameBoard::GameBoard((GameBoard *)local_230,iVar1,0x28,0x3c,&local_248);
  std::__cxx11::list<Player,_std::allocator<Player>_>::~list(&local_248);
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting game!");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  GameBoard::printGameStatistics((GameBoard *)local_230);
  GameBoard::~GameBoard((GameBoard *)local_230);
  return in_RDI;
}

Assistant:

list<Player> initializeGameBoard()                                           //initializes players and their number, min and max number of cards for each player(same)
{
    int playernum = rand()%7 + 2;                                            //random num from [2, 8]
    int min = 40;                                                            //default limits
    int max = 60;

    list<Player> myplayers;
    int i;

    for (i=0; i<playernum; i++)                                              //create playernum players
    {
        //passes limits for decks and creates them in player constructor
        Player play(min, max);
        myplayers.push_back(play);
    }

    GameBoard board(playernum, min, max, myplayers);                         //create board
    cout << "Starting game!"<<endl<<endl;
    board.printGameStatistics();                                             //print stats

    return myplayers;
}